

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdpostct.c
# Opt level: O0

void post_process_2pass(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION *in_row_group_ctr,
                       JDIMENSION in_row_groups_avail,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
                       JDIMENSION out_rows_avail)

{
  long lVar1;
  uint uVar2;
  undefined8 uVar3;
  long in_RDI;
  long in_R8;
  uint *in_R9;
  JDIMENSION max_rows;
  JDIMENSION num_rows;
  my_post_ptr post;
  undefined4 local_3c;
  
  lVar1 = *(long *)(in_RDI + 0x238);
  if (*(int *)(lVar1 + 0x28) == 0) {
    uVar3 = (**(code **)(*(long *)(in_RDI + 8) + 0x38))
                      (in_RDI,*(undefined8 *)(lVar1 + 0x10),*(undefined4 *)(lVar1 + 0x24),
                       *(undefined4 *)(lVar1 + 0x20),0);
    *(undefined8 *)(lVar1 + 0x18) = uVar3;
  }
  local_3c = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x28);
  if (max_rows - *in_R9 < local_3c) {
    local_3c = max_rows - *in_R9;
  }
  uVar2 = *(int *)(in_RDI + 0x8c) - *(int *)(lVar1 + 0x24);
  if (uVar2 < local_3c) {
    local_3c = uVar2;
  }
  (**(code **)(*(long *)(in_RDI + 0x270) + 8))
            (in_RDI,*(long *)(lVar1 + 0x18) + (ulong)*(uint *)(lVar1 + 0x28) * 8,
             in_R8 + (ulong)*in_R9 * 8,local_3c);
  *in_R9 = local_3c + *in_R9;
  *(uint *)(lVar1 + 0x28) = local_3c + *(int *)(lVar1 + 0x28);
  if (*(uint *)(lVar1 + 0x20) <= *(uint *)(lVar1 + 0x28)) {
    *(int *)(lVar1 + 0x24) = *(int *)(lVar1 + 0x20) + *(int *)(lVar1 + 0x24);
    *(undefined4 *)(lVar1 + 0x28) = 0;
  }
  return;
}

Assistant:

METHODDEF(void)
post_process_2pass(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                   JDIMENSION *in_row_group_ctr,
                   JDIMENSION in_row_groups_avail, JSAMPARRAY output_buf,
                   JDIMENSION *out_row_ctr, JDIMENSION out_rows_avail)
{
  my_post_ptr post = (my_post_ptr)cinfo->post;
  JDIMENSION num_rows, max_rows;

  /* Reposition virtual buffer if at start of strip. */
  if (post->next_row == 0) {
    post->buffer = (*cinfo->mem->access_virt_sarray)
        ((j_common_ptr)cinfo, post->whole_image,
         post->starting_row, post->strip_height, FALSE);
  }

  /* Determine number of rows to emit. */
  num_rows = post->strip_height - post->next_row; /* available in strip */
  max_rows = out_rows_avail - *out_row_ctr; /* available in output area */
  if (num_rows > max_rows)
    num_rows = max_rows;
  /* We have to check bottom of image here, can't depend on upsampler. */
  max_rows = cinfo->output_height - post->starting_row;
  if (num_rows > max_rows)
    num_rows = max_rows;

  /* Quantize and emit data. */
  (*cinfo->cquantize->color_quantize) (cinfo, post->buffer + post->next_row,
                                       output_buf + *out_row_ctr,
                                       (int)num_rows);
  *out_row_ctr += num_rows;

  /* Advance if we filled the strip. */
  post->next_row += num_rows;
  if (post->next_row >= post->strip_height) {
    post->starting_row += post->strip_height;
    post->next_row = 0;
  }
}